

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::SPFForceManager(SPFForceManager *this,SimInfo *info)

{
  int iVar1;
  SnapshotManager *pSVar2;
  Snapshot *pSVar3;
  Globals *this_00;
  void *pvVar4;
  undefined8 *in_RDI;
  bool usePBC;
  int cgStorageLayout;
  int rbStorageLayout;
  int atomStorageLayout;
  int nCutoffGroups;
  int nRigidBodies;
  int nAtoms;
  undefined1 in_stack_0000021b;
  int in_stack_0000021c;
  int in_stack_00000220;
  int in_stack_00000224;
  int in_stack_00000228;
  int in_stack_0000022c;
  Snapshot *in_stack_00000230;
  int in_stack_00000240;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  SimInfo *in_stack_ffffffffffffff98;
  ForceManager *in_stack_ffffffffffffffa0;
  
  ForceManager::ForceManager(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RDI = &PTR__SPFForceManager_00503838;
  std::unique_ptr<OpenMD::Thermo,std::default_delete<OpenMD::Thermo>>::
  unique_ptr<std::default_delete<OpenMD::Thermo>,void>
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (nullptr_t)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  in_RDI[0x192] = 0;
  in_RDI[0x193] = 0;
  in_RDI[0x194] = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3565ab);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3565c7);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x3565e3)
  ;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3565ff);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x35661b);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x356637)
  ;
  *(undefined1 *)(in_RDI + 0x1a7) = 0;
  in_RDI[0x1a8] = 0;
  *(undefined4 *)(in_RDI + 0x1a9) = 0;
  in_RDI[0x1aa] = 0;
  in_RDI[0x1ab] = 0;
  in_RDI[0x1ac] = 0;
  std::make_unique<OpenMD::Thermo,OpenMD::SimInfo*&>
            ((SimInfo **)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::operator=
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::~unique_ptr
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  pSVar2 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[3]);
  pSVar3 = SnapshotManager::getCurrentSnapshot(pSVar2);
  in_RDI[0x192] = pSVar3;
  this_00 = SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  Globals::getRNEMDParameters(this_00);
  iVar1 = RNEMDParameters::getSPFScalingPower((RNEMDParameters *)0x356738);
  *(int *)(in_RDI + 0x1a9) = iVar1;
  SimInfo::getNAtoms((SimInfo *)in_RDI[3]);
  SimInfo::getNRigidBodies((SimInfo *)in_RDI[3]);
  SimInfo::getNCutoffGroups((SimInfo *)in_RDI[3]);
  pSVar2 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[3]);
  SnapshotManager::getAtomStorageLayout(pSVar2);
  pSVar2 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[3]);
  SnapshotManager::getRigidBodyStorageLayout(pSVar2);
  pSVar2 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[3]);
  SnapshotManager::getCutoffGroupStorageLayout(pSVar2);
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  Globals::getUsePeriodicBoundaryConditions((Globals *)0x356869);
  pvVar4 = operator_new(0xa98);
  Snapshot::Snapshot(in_stack_00000230,in_stack_0000022c,in_stack_00000228,in_stack_00000224,
                     in_stack_00000220,in_stack_0000021c,in_stack_00000240,(bool)in_stack_0000021b);
  in_RDI[0x193] = pvVar4;
  pvVar4 = operator_new(0xa98);
  Snapshot::Snapshot(in_stack_00000230,in_stack_0000022c,in_stack_00000228,in_stack_00000224,
                     in_stack_00000220,in_stack_0000021c,in_stack_00000240,(bool)in_stack_0000021b);
  in_RDI[0x194] = pvVar4;
  return;
}

Assistant:

SPFForceManager::SPFForceManager(SimInfo* info) :
      ForceManager {info}, potentialSource_ {}, potentialSink_ {} {
    thermo_          = std::make_unique<Thermo>(info);
    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

    k_ = info_->getSimParams()->getRNEMDParameters()->getSPFScalingPower();

    int nAtoms        = info_->getNAtoms();
    int nRigidBodies  = info_->getNRigidBodies();
    int nCutoffGroups = info_->getNCutoffGroups();

    int atomStorageLayout = info_->getSnapshotManager()->getAtomStorageLayout();
    int rbStorageLayout =
        info_->getSnapshotManager()->getRigidBodyStorageLayout();
    int cgStorageLayout =
        info_->getSnapshotManager()->getCutoffGroupStorageLayout();

    bool usePBC = info_->getSimParams()->getUsePeriodicBoundaryConditions();

    temporarySourceSnapshot_ =
        new Snapshot(nAtoms, nRigidBodies, nCutoffGroups, atomStorageLayout,
                     rbStorageLayout, cgStorageLayout, usePBC);

    temporarySinkSnapshot_ =
        new Snapshot(nAtoms, nRigidBodies, nCutoffGroups, atomStorageLayout,
                     rbStorageLayout, cgStorageLayout, usePBC);
  }